

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void * XML_GetBuffer(XML_Parser parser,int len)

{
  XML_Parsing XVar1;
  char *__dest;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (parser == (XML_Parser)0x0) {
    return (void *)0x0;
  }
  if (len < 0) goto LAB_005e771e;
  XVar1 = (parser->m_parsingStatus).parsing;
  if (XVar1 == XML_FINISHED) {
    parser->m_errorCode = XML_ERROR_FINISHED;
    return (void *)0x0;
  }
  if (XVar1 == XML_SUSPENDED) {
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return (void *)0x0;
  }
  pcVar8 = parser->m_bufferLim;
  if ((pcVar8 == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)pcVar8 - (long)parser->m_bufferEnd;
  }
  __dest = parser->m_bufferEnd;
  if ((long)(ulong)(uint)len <= lVar6) {
    return __dest;
  }
  iVar2 = 0;
  if ((__dest != (char *)0x0) && (iVar2 = 0, parser->m_bufferPtr != (char *)0x0)) {
    iVar2 = (int)__dest - (int)parser->m_bufferPtr;
  }
  uVar3 = iVar2 + len;
  if ((int)uVar3 < 0) goto LAB_005e771e;
  pcVar7 = parser->m_bufferPtr;
  iVar2 = 0;
  if ((pcVar7 != (char *)0x0) && (parser->m_buffer != (char *)0x0)) {
    iVar2 = (int)pcVar7 - (int)parser->m_buffer;
  }
  iVar5 = 0x400;
  if (iVar2 < 0x400) {
    iVar5 = iVar2;
  }
  if ((int)(uVar3 ^ 0x7fffffff) < iVar5) goto LAB_005e771e;
  iVar4 = uVar3 + iVar5;
  if (pcVar8 == (char *)0x0) {
    if (iVar4 < 1) goto LAB_005e77ee;
LAB_005e776d:
    uVar3 = 0x400;
LAB_005e7772:
    do {
      uVar3 = uVar3 * 2;
      if (iVar4 <= (int)uVar3) break;
    } while (0 < (int)uVar3);
    if ((int)uVar3 < 1) {
LAB_005e771e:
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return (void *)0x0;
    }
    __dest = (char *)(*(parser->m_mem).malloc_fcn)((ulong)uVar3);
    if (__dest == (char *)0x0) goto LAB_005e771e;
    parser->m_bufferLim = __dest + uVar3;
    pcVar8 = parser->m_bufferPtr;
    if (pcVar8 == (char *)0x0) {
      parser->m_bufferEnd = __dest;
      parser->m_buffer = __dest;
      pcVar8 = __dest;
    }
    else {
      lVar6 = (long)parser->m_bufferEnd - (long)pcVar8;
      if (parser->m_bufferEnd == (char *)0x0) {
        lVar6 = 0;
      }
      memcpy(__dest,pcVar8 + -iVar5,lVar6 + iVar5);
      (*(parser->m_mem).free_fcn)(parser->m_buffer);
      parser->m_buffer = __dest;
      if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
        lVar6 = 0;
      }
      else {
        lVar6 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
      }
      pcVar8 = __dest + iVar5;
      __dest = pcVar8 + lVar6;
      parser->m_bufferEnd = __dest;
    }
  }
  else {
    lVar6 = (long)pcVar8 - (long)parser->m_buffer;
    if (parser->m_buffer == (char *)0x0) {
      lVar6 = 0;
    }
    if (lVar6 < iVar4) {
      if ((pcVar7 == (char *)0x0) || (uVar3 = (int)pcVar8 - (int)pcVar7, uVar3 == 0))
      goto LAB_005e776d;
      goto LAB_005e7772;
    }
LAB_005e77ee:
    if (pcVar7 == (char *)0x0) {
      if (-1 < iVar2) goto LAB_005e786e;
      pcVar8 = parser->m_buffer;
      pcVar7 = (char *)0x0;
      iVar2 = 0;
    }
    else {
      pcVar8 = parser->m_buffer;
      lVar6 = (long)pcVar7 - (long)pcVar8;
      if (pcVar8 == (char *)0x0) {
        lVar6 = 0;
      }
      if (lVar6 <= iVar5) goto LAB_005e786e;
      iVar2 = (int)((long)pcVar7 - (long)pcVar8);
      if (pcVar8 == (char *)0x0) {
        iVar2 = 0;
      }
    }
    lVar6 = (long)(iVar2 - iVar5);
    memmove(pcVar8,pcVar8 + lVar6,(size_t)(__dest + ((long)iVar5 - (long)pcVar7)));
    __dest = parser->m_bufferEnd + -lVar6;
    parser->m_bufferEnd = __dest;
    pcVar8 = parser->m_bufferPtr + -lVar6;
  }
  parser->m_bufferPtr = pcVar8;
LAB_005e786e:
  parser->m_eventPtr = (char *)0x0;
  parser->m_eventEndPtr = (char *)0x0;
  parser->m_positionPtr = (char *)0x0;
  return __dest;
}

Assistant:

void *XMLCALL
XML_GetBuffer(XML_Parser parser, int len) {
  if (parser == NULL)
    return NULL;
  if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return NULL;
  }
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return NULL;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return NULL;
  default:;
  }

  if (len > EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd)) {
#ifdef XML_CONTEXT_BYTES
    int keep;
#endif /* defined XML_CONTEXT_BYTES */
    /* Do not invoke signed arithmetic overflow: */
    int neededSize = (int)((unsigned)len
                           + (unsigned)EXPAT_SAFE_PTR_DIFF(
                               parser->m_bufferEnd, parser->m_bufferPtr));
    if (neededSize < 0) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
#ifdef XML_CONTEXT_BYTES
    keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    /* Detect and prevent integer overflow */
    if (keep > INT_MAX - neededSize) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
    neededSize += keep;
#endif /* defined XML_CONTEXT_BYTES */
    if (neededSize
        <= EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_buffer)) {
#ifdef XML_CONTEXT_BYTES
      if (keep < EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)) {
        int offset
            = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)
              - keep;
        /* The buffer pointers cannot be NULL here; we have at least some bytes
         * in the buffer */
        memmove(parser->m_buffer, &parser->m_buffer[offset],
                parser->m_bufferEnd - parser->m_bufferPtr + keep);
        parser->m_bufferEnd -= offset;
        parser->m_bufferPtr -= offset;
      }
#else
      if (parser->m_buffer && parser->m_bufferPtr) {
        memmove(parser->m_buffer, parser->m_bufferPtr,
                EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
        parser->m_bufferPtr = parser->m_buffer;
      }
#endif /* not defined XML_CONTEXT_BYTES */
    } else {
      char *newBuf;
      int bufferSize
          = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferPtr);
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        /* Do not invoke signed arithmetic overflow: */
        bufferSize = (int)(2U * (unsigned)bufferSize);
      } while (bufferSize < neededSize && bufferSize > 0);
      if (bufferSize <= 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      newBuf = (char *)MALLOC(parser, bufferSize);
      if (newBuf == 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      parser->m_bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (parser->m_bufferPtr) {
        memcpy(newBuf, &parser->m_bufferPtr[-keep],
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
                   + keep);
        FREE(parser, parser->m_buffer);
        parser->m_buffer = newBuf;
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
              + keep;
        parser->m_bufferPtr = parser->m_buffer + keep;
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
        parser->m_bufferPtr = parser->m_buffer = newBuf;
      }
#else
      if (parser->m_bufferPtr) {
        memcpy(newBuf, parser->m_bufferPtr,
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        FREE(parser, parser->m_buffer);
        parser->m_bufferEnd
            = newBuf
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
      }
      parser->m_bufferPtr = parser->m_buffer = newBuf;
#endif /* not defined XML_CONTEXT_BYTES */
    }
    parser->m_eventPtr = parser->m_eventEndPtr = NULL;
    parser->m_positionPtr = NULL;
  }
  return parser->m_bufferEnd;
}